

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O2

void split_parse_frame(SplitContext_t_conflict *ctx,RK_U8 *buf,RK_S32 size)

{
  void *pvVar1;
  RK_S64 *pRVar2;
  
  pvVar1 = ctx->priv_data;
  ctx->key_frame = (uint)((*buf & 4) == 0);
  pRVar2 = &ctx->pts;
  if ((*buf & 2) == 0) {
    *(RK_S64 *)((long)pvVar1 + 0x28) = ctx->pts;
  }
  else {
    if (ctx->pts == -1) {
      *pRVar2 = *(RK_S64 *)((long)pvVar1 + 0x28);
    }
    pRVar2 = (RK_S64 *)((long)pvVar1 + 0x28);
  }
  *pRVar2 = -1;
  return;
}

Assistant:

static void split_parse_frame(SplitContext_t *ctx, RK_U8 *buf, RK_S32 size)
{
    VP9ParseContext *s = (VP9ParseContext *)ctx->priv_data;

    if (buf[0] & 0x4) {
        ctx->key_frame = 0;
    } else {
        ctx->key_frame = 1;
    }

    if (buf[0] & 0x2) {
        if (ctx->pts == -1)
            ctx->pts = s->pts;
        s->pts = -1;
    } else {
        s->pts = ctx->pts;
        ctx->pts = -1;
    }

    (void)size;
}